

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
Net::propagate_back(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Net *this,
                   int cur_layer,vector<double,_std::allocator<double>_> *y,
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   *derivative,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *bias_derivative)

{
  long lVar1;
  pointer pdVar2;
  int iVar3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  int j;
  ulong uVar7;
  int i;
  ulong uVar8;
  double dVar9;
  double dVar10;
  Layer lol;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  lVar5 = (long)cur_layer;
  pvVar4 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18 + -1 != lVar5) {
    add_matrix<double>((vector<double,_std::allocator<double>_> *)
                       &lol.super__Vector_base<double,_std::allocator<double>_>,y,pvVar4 + lVar5);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (y,&lol.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&lol.super__Vector_base<double,_std::allocator<double>_>);
    pvVar4 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  iVar3 = cur_layer + -1;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)*(pointer *)
                    ((long)&pvVar4[iVar3].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&pvVar4[iVar3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data >> 3,(allocator_type *)&lol);
  uVar8 = 0;
  while( true ) {
    pvVar4 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar4[lVar5].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar4[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data >> 3) <= uVar8) break;
    dVar9 = derivative_function(this,*(double *)
                                      (*(long *)&(this->meshZ).
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + uVar8 * 8));
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)((*(double *)
                     (*(long *)&(this->mesh).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + uVar8 * 8) -
                   (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar8]) * (dVar9 + dVar9));
    mult_matrix_on_constant<double>(&lol,pvVar4 + iVar3,(double *)&local_48);
    lVar6 = uVar8 * 0x18;
    add_matrix<double>((vector<double,_std::allocator<double>_> *)&local_48,
                       (vector<double,_std::allocator<double>_> *)
                       (*(long *)&(derivative->
                                  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar5].
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data + lVar6),&lol);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)
               (*(long *)&(derivative->
                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar5].
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data + lVar6),&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    dVar9 = derivative_function(this,*(double *)
                                      (*(long *)&(this->meshZ).
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + uVar8 * 8));
    pvVar4 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = *(long *)&(bias_derivative->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar5].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    *(double *)(lVar1 + uVar8 * 8) =
         (*(double *)
           (*(long *)&pvVar4[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar8 * 8) -
         (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_start[uVar8]) * (dVar9 + dVar9) + *(double *)(lVar1 + uVar8 * 8);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)*(pointer *)
                               ((long)&pvVar4[iVar3].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + 8) -
                        *(long *)&pvVar4[iVar3].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data >> 3); uVar7 = uVar7 + 1) {
      dVar9 = *(double *)
               (*(long *)(*(long *)&(this->weights).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar6) + uVar7 * 8);
      dVar10 = derivative_function(this,*(double *)
                                         (*(long *)&(this->meshZ).
                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + uVar8 * 8));
      pvVar4 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar2[uVar8] =
           (*(double *)
             (*(long *)&pvVar4[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar8 * 8) -
           (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start[uVar8]) * (dVar9 + dVar9) * dVar10 + pdVar2[uVar8];
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&lol.super__Vector_base<double,_std::allocator<double>_>);
    uVar8 = uVar8 + 1;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
  mult_matrix_on_constant<double>(&lol,__return_storage_ptr__,(double *)&local_48);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (__return_storage_ptr__,&lol.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lol.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Net::propagate_back(int cur_layer, std::vector<double> y, std::vector<std::vector<Layer> >& derivative, std::vector<Layer>& bias_derivative){
    if (cur_layer != mesh.size()-1) y = add_matrix(y, mesh[cur_layer]);
    std::vector<double> y_prev(mesh[cur_layer-1].size());
    for (int i = 0; i < mesh[cur_layer].size(); ++i) {
        Layer lol = mult_matrix_on_constant(mesh[cur_layer-1], (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i])));
        derivative[cur_layer][i] = add_matrix(derivative[cur_layer][i], lol);
        bias_derivative[cur_layer][i] += (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));
        for (int j = 0; j < mesh[cur_layer-1].size(); ++j)
            y_prev[i] += (2 * weights[cur_layer][i][j] * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));

//        threshold(derivative[cur_layer][i], MOD); derivative_function
    }
//    threshold(y_prev, 1.0);
//    threshold(bias_derivative[cur_layer], MOD);
    y_prev = mult_matrix_on_constant(y_prev, -1.0);
    return y_prev;
}